

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O3

yyjson_val *
duckdb_yyjson::unsafe_yyjson_ptr_getx(yyjson_val *val,char *ptr,size_t ptr_len,yyjson_ptr_err *err)

{
  yyjson_val *pyVar1;
  yyjson_val_uni *pyVar2;
  byte *__s2;
  int iVar3;
  char *pcVar4;
  ulong uVar5;
  yyjson_ptr_code yVar6;
  byte *pbVar7;
  long lVar8;
  byte bVar9;
  byte *pbVar10;
  ulong uVar11;
  byte *pbVar12;
  byte *pbVar13;
  byte *pbVar14;
  bool bVar15;
  
  pbVar14 = (byte *)(ptr + ptr_len);
  pbVar10 = (byte *)ptr;
  do {
    __s2 = pbVar10 + 1;
    for (pbVar13 = __s2; ((pbVar13 < pbVar14 && (*pbVar13 != 0x2f)) && (*pbVar13 != 0x7e));
        pbVar13 = pbVar13 + 1) {
    }
    if ((pbVar13 == pbVar14) || (*pbVar13 != 0x7e)) {
      pbVar12 = pbVar13 + -(long)__s2;
      bVar15 = true;
    }
    else {
      if (pbVar13 < pbVar14) {
        bVar9 = 0x7e;
        lVar8 = 0;
        pbVar12 = pbVar13;
        do {
          pbVar13 = pbVar12 + 1;
          if (bVar9 == 0x7e) {
            if ((pbVar13 == pbVar14) || ((*pbVar13 & 0xfe) != 0x30)) {
              if (err == (yyjson_ptr_err *)0x0) {
                return (yyjson_val *)0x0;
              }
              pcVar4 = "invalid escaped character";
              yVar6 = 2;
              goto LAB_0121fab4;
            }
            lVar8 = lVar8 + 1;
          }
        } while ((pbVar13 < pbVar14) && (bVar9 = *pbVar13, pbVar12 = pbVar13, bVar9 != 0x2f));
      }
      else {
        lVar8 = 0;
      }
      pbVar12 = pbVar13 + (-(long)__s2 - lVar8);
      bVar15 = lVar8 == 0;
    }
    uVar11 = val->tag;
    if (((byte)uVar11 & 7) == 6) {
      if ((uVar11 < 0x100) || (pbVar12 + -0x14 < (byte *)0xffffffffffffffed)) goto LAB_0121fa9e;
      if (*__s2 == 0x30) {
        if ((byte *)0x1 < pbVar12) goto LAB_0121fa9e;
        uVar5 = 0;
      }
      else {
        if (*__s2 == 0x2d) goto LAB_0121fa9e;
        uVar5 = 0;
        pbVar7 = __s2;
        do {
          if (9 < (ulong)*pbVar7 - 0x30) goto LAB_0121fa9e;
          uVar5 = ((ulong)*pbVar7 - 0x30) + uVar5 * 10;
          pbVar7 = pbVar7 + 1;
        } while (pbVar7 < pbVar10 + (long)(pbVar12 + 1));
        if (uVar5 == 0) goto LAB_0121fa9e;
      }
      if (uVar11 >> 8 <= uVar5) {
LAB_0121fa9e:
        if (err != (yyjson_ptr_err *)0x0) {
          pcVar4 = "JSON pointer cannot be resolved";
          yVar6 = 3;
          pbVar12 = __s2;
LAB_0121fab4:
          err->code = yVar6;
          err->msg = pcVar4;
          err->pos = (long)pbVar12 - (long)ptr;
        }
        return (yyjson_val *)0x0;
      }
      pyVar1 = val + 1;
      pyVar2 = &val->uni;
      val = pyVar1;
      if ((uVar11 >> 4 & 0xfffffffffffffff0) + 0x10 == pyVar2->u64) {
        val = pyVar1 + uVar5;
      }
      else {
        for (; uVar5 != 0; uVar5 = uVar5 - 1) {
          pcVar4 = (char *)0x10;
          if ((~(uint)val->tag & 6) == 0) {
            pcVar4 = (val->uni).str;
          }
          val = (yyjson_val *)(pcVar4 + (long)&val->tag);
        }
      }
    }
    else {
      if ((((uint)uVar11 & 7) != 7) || (uVar11 < 0x100)) goto LAB_0121fa9e;
      uVar11 = uVar11 >> 8;
LAB_0121f8d9:
      if ((byte *)(val[1].tag >> 8) != pbVar12) {
LAB_0121f900:
        pcVar4 = (char *)0x10;
        if ((~(uint)val[2].tag & 6) == 0) {
          pcVar4 = val[2].uni.str;
        }
        val = (yyjson_val *)(pcVar4 + (long)&val[1].tag);
        uVar11 = uVar11 - 1;
        if (uVar11 == 0) goto LAB_0121fa9e;
        goto LAB_0121f8d9;
      }
      if (bVar15) {
        iVar3 = bcmp(val[1].uni.ptr,__s2,(size_t)pbVar12);
        if (iVar3 == 0) goto LAB_0121f96c;
        goto LAB_0121f900;
      }
      if (pbVar12 != (byte *)0x0) {
        pbVar7 = (byte *)0x0;
        pbVar10 = __s2;
        do {
          if (*pbVar10 == 0x7e) {
            bVar9 = 0x2f;
            if (pbVar10[1] == 0x30) {
              bVar9 = 0x7e;
            }
            if (bVar9 != val[1].uni.str[(long)pbVar7]) goto LAB_0121f900;
            pbVar10 = pbVar10 + 1;
          }
          else if (val[1].uni.str[(long)pbVar7] != *pbVar10) goto LAB_0121f900;
          pbVar10 = pbVar10 + 1;
          pbVar7 = pbVar7 + 1;
          if (pbVar12 == pbVar7) break;
        } while( true );
      }
LAB_0121f96c:
      val = val + 2;
    }
    pbVar10 = pbVar13;
    if (pbVar13 == pbVar14) {
      return val;
    }
  } while( true );
}

Assistant:

yyjson_val *unsafe_yyjson_ptr_getx(yyjson_val *val,
                                   const char *ptr, size_t ptr_len,
                                   yyjson_ptr_err *err) {

    const char *hdr = ptr, *end = ptr + ptr_len, *token;
    usize len, esc;
    yyjson_type type;

    while (true) {
        token = ptr_next_token(&ptr, end, &len, &esc);
        if (unlikely(!token)) return_err_syntax(NULL, ptr - hdr);
        type = unsafe_yyjson_get_type(val);
        if (type == YYJSON_TYPE_OBJ) {
            val = ptr_obj_get(val, token, len, esc);
        } else if (type == YYJSON_TYPE_ARR) {
            val = ptr_arr_get(val, token, len, esc);
        } else {
            val = NULL;
        }
        if (!val) return_err_resolve(NULL, token - hdr);
        if (ptr == end) return val;
    }
}